

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall google::protobuf::io::StringOutputStream::BackUp(StringOutputStream *this,int count)

{
  string *psVar1;
  StringOutputStream *extraout_RAX;
  StringOutputStream *pSVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  StringOutputStream *pSVar6;
  long *plVar7;
  undefined1 auStack_1058 [4096];
  long alStack_28 [3];
  StringOutputStream local_10;
  
  pSVar6 = (StringOutputStream *)(ulong)(uint)count;
  if (count < 0) {
    pSVar6 = &local_10;
    alStack_28[1] = 0x16811a;
    BackUp();
  }
  else {
    psVar1 = this->target_;
    if (psVar1 != (string *)0x0) {
      pSVar2 = (StringOutputStream *)(ulong)(uint)count;
      pSVar6 = (StringOutputStream *)psVar1->_M_string_length;
      if (pSVar2 <= pSVar6) {
        std::__cxx11::string::resize((ulong)psVar1,(char)pSVar6 - (char)count);
        return;
      }
      goto LAB_00168124;
    }
  }
  alStack_28[1] = 0x168124;
  BackUp(&local_10);
  pSVar2 = extraout_RAX;
LAB_00168124:
  iVar5 = (int)pSVar6;
  alStack_28[1] = 0x168131;
  BackUp();
  if (pSVar2->target_ != (string *)0x0) {
    return;
  }
  plVar7 = alStack_28;
  ByteCount();
  iVar3 = 0;
  do {
    iVar4 = iVar5 - iVar3;
    if (iVar4 == 0 || iVar5 < iVar3) {
      return;
    }
    if (0xfff < iVar4) {
      iVar4 = 0x1000;
    }
    iVar4 = (**(code **)(*plVar7 + 0x10))(plVar7,auStack_1058,iVar4);
    iVar3 = iVar4 + iVar3;
  } while (0 < iVar4);
  return;
}

Assistant:

void StringOutputStream::BackUp(int count) {
  ABSL_CHECK_GE(count, 0);
  ABSL_CHECK(target_ != nullptr);
  ABSL_CHECK_LE(static_cast<size_t>(count), target_->size());
  target_->resize(target_->size() - count);
}